

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byte_buffer.cpp
# Opt level: O1

uchar __thiscall bidfx_public_api::tools::ByteBuffer::ReadByte(ByteBuffer *this)

{
  ulong uVar1;
  uchar uVar2;
  out_of_range *this_00;
  stringstream ss;
  string local_1c0 [32];
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  if (this->reader_index_ != this->writer_index_) {
    CheckBufferHasData(this,1);
    uVar1 = this->reader_index_ + 1;
    if (this->capacity_ < uVar1) {
      uVar2 = '\0';
    }
    else {
      uVar2 = this->buf_[this->reader_index_];
    }
    this->reader_index_ = uVar1;
    return uVar2;
  }
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_190,"Readable byte limit exceeded: ",0x1e);
  std::ostream::_M_insert<unsigned_long>((ulong)local_190);
  this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::out_of_range::out_of_range(this_00,local_1c0);
  __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

unsigned char ByteBuffer::ReadByte()
{
    if (reader_index_ == writer_index_)
    {
        std::stringstream ss;
        ss << "Readable byte limit exceeded: " << reader_index_;
        throw std::out_of_range(ss.str());
    }
    return GetNextByte();
}